

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O0

sexp sexp_double_to_ratio(sexp ctx,double f)

{
  undefined4 uVar1;
  undefined8 ctx_00;
  undefined8 a;
  sexp in_RDI;
  sexp in_XMM0_Qa;
  double dVar2;
  sexp_gc_var_t __sexp_gc_preserver3;
  sexp scale;
  sexp_gc_var_t __sexp_gc_preserver2;
  sexp whole;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp res;
  int i;
  int sign;
  sexp in_stack_ffffffffffffff48;
  sexp in_stack_ffffffffffffff50;
  sexp in_stack_ffffffffffffff58;
  sexp in_stack_ffffffffffffff60;
  undefined8 b;
  undefined7 in_stack_ffffffffffffff78;
  undefined1 uVar3;
  sexp ctx_01;
  sexp rat;
  sexp ctx_02;
  sexp_gc_var_t *psVar4;
  double f_00;
  sexp psVar5;
  undefined8 in_stack_ffffffffffffffb0;
  undefined8 ctx_03;
  undefined8 d;
  undefined8 a_00;
  undefined8 b_00;
  undefined4 uVar6;
  undefined8 local_18;
  undefined8 local_8;
  
  memset(&stack0xffffffffffffffc8,0,0x10);
  memset(&stack0xffffffffffffffb0,0,0x10);
  f_00 = 5.36555291383594e-321;
  memset(&stack0xffffffffffffff98,0,0x10);
  rat = in_XMM0_Qa;
  dVar2 = trunc((double)in_XMM0_Qa);
  if (((double)rat != dVar2) || (NAN((double)rat) || NAN(dVar2))) {
    a_00 = &stack0xffffffffffffffd8;
    b_00 = (in_RDI->value).context.saves;
    (in_RDI->value).context.saves = (sexp_gc_var_t *)&stack0xffffffffffffffc8;
    ctx_03 = &stack0xffffffffffffffc0;
    d = (in_RDI->value).context.saves;
    (in_RDI->value).context.saves = (sexp_gc_var_t *)&stack0xffffffffffffffb0;
    ctx_02 = (sexp)&stack0xffffffffffffffa8;
    psVar4 = (in_RDI->value).context.saves;
    (in_RDI->value).context.saves = (sexp_gc_var_t *)&stack0xffffffffffffff98;
    ctx_01 = in_RDI;
    trunc((double)in_XMM0_Qa);
    ctx_00 = sexp_double_to_bignum((sexp)ctx_03,f_00);
    a = sexp_fixnum_to_bignum(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    psVar5 = (sexp)&DAT_00000003;
    uVar1 = 1;
    if ((double)in_XMM0_Qa < 0.0) {
      uVar1 = 0xffffffff;
    }
    uVar6 = 0;
    dVar2 = trunc((double)in_XMM0_Qa);
    local_18 = ABS((double)in_XMM0_Qa - dVar2);
    while( true ) {
      b = local_18;
      dVar2 = trunc((double)local_18);
      uVar3 = false;
      if (((double)b != dVar2) || (NAN((double)b) || NAN(dVar2))) {
        uVar3 = (int)uVar6 < 0xf;
      }
      if ((bool)uVar3 == false) break;
      in_stack_ffffffffffffff58 =
           sexp_bignum_fxmul((sexp)ctx_00,(sexp)d,(sexp)ctx_03,(sexp_uint_t)psVar5,
                             (int)((ulong)psVar4 >> 0x20));
      in_stack_ffffffffffffff48 = (sexp)0x4024000000000000;
      psVar5 = (sexp)((double)local_18 * 10.0);
      in_stack_ffffffffffffff50 = in_RDI;
      in_stack_ffffffffffffff60 = psVar5;
      trunc((double)psVar5 / 10.0);
      a = sexp_bignum_fxadd(ctx_01,(sexp)CONCAT17(uVar3,in_stack_ffffffffffffff78),b);
      dVar2 = trunc((double)psVar5);
      local_18 = (double)psVar5 - dVar2;
      psVar5 = sexp_mul((sexp)CONCAT44(uVar1,uVar6),(sexp)a,(sexp)b_00);
      uVar6 = uVar6 + 1;
    }
    (((sexp)a)->value).flonum_bits[0] = (char)uVar1;
    sexp_bignum_normalize(in_stack_ffffffffffffff48);
    sexp_bignum_normalize(in_stack_ffffffffffffff48);
    sexp_make_ratio(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
    sexp_ratio_normalize(ctx_02,rat,in_XMM0_Qa);
    local_8 = sexp_add((sexp)b_00,(sexp)a_00,(sexp)ctx_00);
    (in_RDI->value).context.saves = (sexp_gc_var_t *)b_00;
  }
  else {
    sexp_double_to_bignum((sexp)in_stack_ffffffffffffffb0,f_00);
    local_8 = sexp_bignum_normalize(in_stack_ffffffffffffff48);
  }
  return (sexp)local_8;
}

Assistant:

sexp sexp_double_to_ratio (sexp ctx, double f) {
  int sign, i;
  sexp_gc_var3(res, whole, scale);
  if (f == trunc(f))
    return sexp_bignum_normalize(sexp_double_to_bignum(ctx, f));
  sexp_gc_preserve3(ctx, res, whole, scale);
  whole = sexp_double_to_bignum(ctx, trunc(f));
  res = sexp_fixnum_to_bignum(ctx, SEXP_ZERO);
  scale = SEXP_ONE;
  sign = (f < 0 ? -1 : 1);
  for (i=0, f=fabs(f-trunc(f)); f != trunc(f) && i < 15; i++) {
    res = sexp_bignum_fxmul(ctx, NULL, res, 10, 0);
    f = f * 10;
    res = sexp_bignum_fxadd(ctx, res, (sexp_uint_t)double_10s_digit(f));
    f = f - trunc(f);
    scale = sexp_mul(ctx, scale, SEXP_TEN);
  }
  sexp_bignum_sign(res) = sign;
  res = sexp_bignum_normalize(res);
  scale = sexp_bignum_normalize(scale);
  res = sexp_make_ratio(ctx, res, scale);
  res = sexp_ratio_normalize(ctx, res, SEXP_FALSE);
  res = sexp_add(ctx, res, whole);
  sexp_gc_release3(ctx);
  return res;
}